

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_TestShell::createTest
          (TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_TestShell *this
          )

{
  TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_Test *this_00;
  
  this_00 = (TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_Test *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
                         ,0x77);
  TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_Test::
  TEST_CommandLineTestRunner_OnePluginGetsInstalledDuringTheRunningTheTests_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineTestRunner, OnePluginGetsInstalledDuringTheRunningTheTests)
{
    const char* argv[] = { "tests.exe", "-psomething"};

    registry.installPlugin(pluginCountingPlugin);

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    registry.removePluginByName("PluginCountingPlugin");

    LONGS_EQUAL(0, registry.countPlugins());
    LONGS_EQUAL(1, pluginCountingPlugin->amountOfPlugins);
}